

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O0

TypeDef __thiscall winmd::reader::cache::find(cache *this,string_view *type_string)

{
  size_type this_00;
  size_type __pos;
  size_type __n;
  TypeDef TVar1;
  TypeDef TVar2;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78 [2];
  allocator<char> local_51;
  string local_50;
  size_type local_30;
  size_type pos;
  string_view *type_string_local;
  cache *this_local;
  
  pos = (size_type)type_string;
  type_string_local = (string_view *)this;
  local_30 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::rfind
                       (type_string,'.',0xffffffffffffffff);
  if (local_30 == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Type \'",&local_51);
    impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[35]>
              (&local_50,(basic_string_view<char,_std::char_traits<char>_> *)pos,
               (char (*) [35])"\' is missing a namespace qualifier");
  }
  local_78[0] = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)pos,0,local_30);
  this_00 = pos;
  __pos = local_30 + 1;
  __n = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)pos);
  local_88 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)this_00,__pos,__n);
  TVar1 = find(this,local_78,&local_88);
  TVar2.super_row_base<winmd::reader::TypeDef>._12_4_ = 0;
  TVar2.super_row_base<winmd::reader::TypeDef>.m_table =
       (table_base *)SUB128(TVar1.super_row_base<winmd::reader::TypeDef>._0_12_,0);
  TVar2.super_row_base<winmd::reader::TypeDef>.m_index =
       SUB124(TVar1.super_row_base<winmd::reader::TypeDef>._0_12_,8);
  return (TypeDef)TVar2.super_row_base<winmd::reader::TypeDef>;
}

Assistant:

TypeDef find(std::string_view const& type_string) const
        {
            auto pos = type_string.rfind('.');

            if (pos == std::string_view::npos)
            {
                impl::throw_invalid("Type '", type_string, "' is missing a namespace qualifier");
            }

            return find(type_string.substr(0, pos), type_string.substr(pos + 1, type_string.size()));
        }